

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<int>::Swap(RepeatedField<int> *this,RepeatedField<int> *other)

{
  Arena *pAVar1;
  Arena *arena;
  RepeatedField<int> temp;
  RepeatedField<int> RStack_28;
  
  if (this != other) {
    pAVar1 = GetArena(this);
    arena = GetArena(other);
    if (pAVar1 == arena) {
      InternalSwap(this,other);
      return;
    }
    RepeatedField(&RStack_28,arena);
    MergeFrom(&RStack_28,this);
    CopyFrom(this,other);
    UnsafeArenaSwap(other,&RStack_28);
    ~RepeatedField(&RStack_28);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  Arena* arena = GetArena();
  Arena* other_arena = other->GetArena();
  if (internal::CanUseInternalSwap(arena, other_arena)) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other_arena);
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}